

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

void __thiscall
r_exec::IPGMContext::copy_structure_to_value_array
          (IPGMContext *this,bool prefix,uint16_t write_index,uint16_t *extent_index,
          bool dereference_cptr)

{
  ushort uVar1;
  ushort uVar2;
  Atom *pAVar3;
  char cVar4;
  bool bVar5;
  uint16_t opcode;
  int iVar6;
  Atom *pAVar7;
  uint16_t i_2;
  uint16_t i;
  ushort uVar8;
  Operator local_40;
  
  cVar4 = r_code::Atom::getDescriptor();
  if (cVar4 == -0x3b) {
    opcode = r_code::Atom::asOpcode();
    Operator::Get(&local_40,opcode);
    if (local_40._operator == syn) {
      copy_member_to_value_array(this,1,prefix,write_index,extent_index,dereference_cptr);
      return;
    }
  }
  iVar6 = (*(this->super__Context)._vptr__Context[6])(this);
  uVar1 = (this->super__Context).index;
  pAVar3 = (this->super__Context).code;
  pAVar7 = r_code::vector<r_code::Atom>::operator[]
                     (&((this->super__Context).overlay)->values,(ulong)write_index);
  r_code::Atom::operator=(pAVar7,pAVar3 + (ulong)uVar1 * 4);
  uVar1 = (ushort)iVar6;
  *extent_index = uVar1 + write_index + 1;
  cVar4 = r_code::Atom::getDescriptor();
  if (cVar4 == -0x40) {
    if (!dereference_cptr) {
      copy_member_to_value_array(this,1,prefix,write_index + 1,extent_index,false);
      for (uVar8 = 2; uVar8 <= uVar1; uVar8 = uVar8 + 1) {
        uVar2 = (this->super__Context).index;
        pAVar3 = (this->super__Context).code;
        pAVar7 = r_code::vector<r_code::Atom>::operator[]
                           (&((this->super__Context).overlay)->values,
                            (ulong)(ushort)(write_index + uVar8));
        r_code::Atom::operator=(pAVar7,pAVar3 + (ulong)uVar8 * 4 + (ulong)uVar2 * 4);
      }
      return;
    }
  }
  else if (cVar4 == -0x39) {
    for (uVar8 = 1; uVar8 <= uVar1; uVar8 = uVar8 + 1) {
      uVar2 = (this->super__Context).index;
      pAVar3 = (this->super__Context).code;
      pAVar7 = r_code::vector<r_code::Atom>::operator[]
                         (&((this->super__Context).overlay)->values,
                          (ulong)(ushort)(write_index + uVar8));
      r_code::Atom::operator=(pAVar7,pAVar3 + (ulong)uVar8 * 4 + (ulong)uVar2 * 4);
    }
    return;
  }
  bVar5 = is_cmd_with_cptr(this);
  if (bVar5) {
    for (uVar8 = 1; uVar8 <= uVar1; uVar8 = uVar8 + 1) {
      copy_member_to_value_array(this,uVar8,prefix,write_index + uVar8,extent_index,uVar8 != 2);
    }
  }
  else {
    for (uVar8 = 1; uVar8 <= uVar1; uVar8 = uVar8 + 1) {
      copy_member_to_value_array
                (this,uVar8,prefix,write_index + uVar8,extent_index,uVar8 != 1 || dereference_cptr);
    }
  }
  return;
}

Assistant:

void IPGMContext::copy_structure_to_value_array(bool prefix, uint16_t write_index, uint16_t &extent_index, bool dereference_cptr)   // prefix: by itpr or not.
{
    if (code[index].getDescriptor() == Atom::OPERATOR && Operator::Get(code[index].asOpcode()).is_syn()) {
        copy_member_to_value_array(1, prefix, write_index, extent_index, dereference_cptr);
    } else {
        uint16_t atom_count = getChildrenCount();
        overlay->values[write_index++] = code[index];
        extent_index = write_index + atom_count;

        switch (code[index].getDescriptor()) {
        case Atom::TIMESTAMP:
            for (uint16_t i = 1; i <= atom_count; ++i) {
                overlay->values[write_index++] = code[index + i];
            }

            break;

        case Atom::C_PTR:
            if (!dereference_cptr) {
                copy_member_to_value_array(1, prefix, write_index++, extent_index, false);

                for (uint16_t i = 2; i <= atom_count; ++i) {
                    overlay->values[write_index++] = code[index + i];
                }

                //Atom::Trace(&overlay->values[0],overlay->values.size());
                break;
            } // else, dereference the c_ptr.

        default:
            if (is_cmd_with_cptr()) {
                for (uint16_t i = 1; i <= atom_count; ++i) {
                    copy_member_to_value_array(i, prefix, write_index++, extent_index, i != 2);
                }
            } else {
                for (uint16_t i = 1; i <= atom_count; ++i) {
                    copy_member_to_value_array(i, prefix, write_index++, extent_index, !(!dereference_cptr && i == 1));
                }
            }
        }
    }
}